

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsOn(cmMakefile *this,string *name)

{
  bool bVar1;
  cmValue local_20;
  string *local_18;
  string *name_local;
  cmMakefile *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  local_20 = GetDefinition(this,name);
  bVar1 = cmValue::IsOn(&local_20);
  return bVar1;
}

Assistant:

bool cmMakefile::IsOn(const std::string& name) const
{
  return this->GetDefinition(name).IsOn();
}